

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  char *pcVar4;
  GLint *pGVar5;
  void *pvVar6;
  FILE *pFVar7;
  ulong uVar8;
  size_t __size;
  bool bVar9;
  GLint binaryLength;
  GLenum binaryFormat;
  GLuint local_430;
  GLsizei length;
  char *local_428;
  GLint status;
  GLsizei len;
  char log [1000];
  
  pcVar4 = getenv("DRY_RUN");
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    return 0x7d;
  }
  glfwMakeContextCurrent(window);
  iVar1 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar1 == 0) {
    return 1;
  }
  if (GLAD_GL_KHR_debug != 0) {
    (*glad_glDebugMessageCallback)(debugMessageCallback,(void *)0x0);
  }
  if (GLAD_GL_ARB_get_program_binary == 0 && GLAD_GL_VERSION_4_1 == 0) {
    iVar1 = 0x7d;
    goto LAB_00108241;
  }
  binaryLength = 0;
  (*glad_glGetIntegerv)(0x87fe,&binaryLength);
  uVar8 = (ulong)(uint)binaryLength;
  if ((pcVar4 == (char *)0x0 && binaryLength != 0) || (binaryLength < 0)) {
    pcVar4 = "error: glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS) = %i\n";
LAB_00108238:
    fprintf(_stderr,pcVar4,uVar8);
  }
  else {
    local_428 = pcVar4;
    pGVar5 = (GLint *)operator_new__(uVar8 * 4 + 4);
    pGVar5[uVar8] = 0xbadf00d;
    (*glad_glGetIntegerv)(0x87ff,pGVar5);
    if (pGVar5[binaryLength] != 0xbadf00d) {
      fwrite("error: glGetIntegerv(GL_PROGRAM_BINARY_FORMATS) overflowed\n",0x3b,1,_stderr);
      goto LAB_0010823f;
    }
    (*glad_glClearColor)(0.3,0.1,0.3,1.0);
    GVar2 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar2,1,&init()::fragShaderText,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    local_430 = GVar2;
    (*glad_glGetShaderiv)(GVar2,0x8b81,&length);
    if (length == 0) {
      (*glad_glGetShaderInfoLog)(local_430,1000,(GLsizei *)&binaryFormat,log);
      pcVar4 = "error: compiling fragment shader:\n%s\n";
    }
    else {
      GVar2 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar2,1,&init()::vertShaderText,(GLint *)0x0);
      (*glad_glCompileShader)(GVar2);
      (*glad_glGetShaderiv)(GVar2,0x8b81,&length);
      if (length == 0) {
        (*glad_glGetShaderInfoLog)(GVar2,1000,(GLsizei *)&binaryFormat,log);
        pcVar4 = "error: compiling vertex shader:\n%s\n";
      }
      else {
        program = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(program,local_430);
        (*glad_glAttachShader)(program,GVar2);
        (*glad_glBindAttribLocation)(program,0,"pos");
        (*glad_glBindAttribLocation)(program,1,"color");
        (*glad_glProgramParameteri)(program,0x8257,1);
        (*glad_glLinkProgram)(program);
        (*glad_glGetProgramiv)(program,0x8b82,&length);
        pcVar4 = local_428;
        if (length != 0) {
          bVar9 = local_428 == (char *)0x0;
          glfwGetFramebufferSize(window,(int *)log,&binaryLength);
          (*glad_glViewport)(0,0,log._0_4_,binaryLength);
          draw();
          binaryLength = 0;
          (*glad_glGetProgramiv)(program,0x8741,&binaryLength);
          if ((bVar9 && binaryLength != 0) || (binaryLength < 0)) {
LAB_00108231:
            uVar8 = (ulong)(uint)binaryLength;
            pcVar4 = "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n";
            goto LAB_00108238;
          }
          do {
            GVar3 = (*glad_glGetError)();
          } while (GVar3 != 0);
          iVar1 = 0x2000000;
          if (0 < binaryLength) {
            iVar1 = binaryLength;
          }
          pvVar6 = malloc((long)iVar1);
          length = 0;
          binaryFormat = 0;
          (*glad_glGetProgramBinary)(program,iVar1,&length,&binaryFormat,pvVar6);
          GVar3 = (*glad_glGetError)();
          if ((pcVar4 == (char *)0x0) && (GVar3 == 0)) goto LAB_00108231;
          if (pcVar4 != (char *)0x0) {
            pFVar7 = fopen("program_binary.bin","wb");
            fwrite(&binaryFormat,4,1,pFVar7);
            fwrite(&binaryLength,4,1,pFVar7);
            fwrite(pvVar6,1,(long)binaryLength,pFVar7);
            fclose(pFVar7);
          }
          free(pvVar6);
          (*glad_glDeleteShader)(local_430);
          (*glad_glDeleteShader)(GVar2);
          (*glad_glDeleteProgram)(program);
          program = (*glad_glCreateProgram)();
          pFVar7 = fopen("program_binary.bin","rb");
          fread(&binaryFormat,4,1,pFVar7);
          fread(&binaryLength,4,1,pFVar7);
          __size = (size_t)binaryLength;
          pvVar6 = malloc(__size);
          fread(pvVar6,1,__size,pFVar7);
          fclose(pFVar7);
          (*glad_glProgramBinary)(program,binaryFormat,pvVar6,binaryLength);
          status = 0;
          (*glad_glGetProgramiv)(program,0x8b82,&status);
          if (status == 0) {
            bVar9 = local_428 != (char *)0x0;
            (*glad_glGetProgramInfoLog)(program,1000,&len,log);
            fprintf(_stderr,"warning: glProgramBinary failed -- %s\n",log);
            if (bVar9 || status == 0) {
              if (status == 0) goto LAB_001080a5;
              goto LAB_001080a0;
            }
          }
          else if (local_428 != (char *)0x0) {
LAB_001080a0:
            draw();
LAB_001080a5:
            glfwDestroyWindow(window);
            glfwTerminate();
            return 0;
          }
          goto LAB_0010823f;
        }
        (*glad_glGetProgramInfoLog)(program,1000,(GLsizei *)&binaryFormat,log);
        pcVar4 = "error: linking:\n%s\n";
      }
    }
    fprintf(_stderr,pcVar4,log);
  }
LAB_0010823f:
  iVar1 = 1;
LAB_00108241:
  exit(iVar1);
}

Assistant:

int
main(int argc, char *argv[])
{
    tracing = !getenv("DRY_RUN");

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
         return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
    }

    if (GLAD_GL_KHR_debug) {
        glDebugMessageCallback(&debugMessageCallback, NULL);
    }

    init();
    reshape();
    draw();

    GLint binaryLength = 0;
    glGetProgramiv(program, GL_PROGRAM_BINARY_LENGTH, &binaryLength);
    if ((tracing && binaryLength != 0) ||
        binaryLength < 0) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    while (glGetError() != GL_NO_ERROR) ;

    GLsizei bufSize = binaryLength > 0 ? binaryLength : 32 * 1024 * 1024;
    void *binary = malloc(bufSize);
    GLsizei length = 0;
    GLenum binaryFormat = GL_NONE;
    glGetProgramBinary(program, bufSize, &length, &binaryFormat, binary);
    GLenum error = glGetError();
    if (tracing && error == GL_NO_ERROR) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    FILE *fp;

    if (!tracing) {
        fp = fopen("program_binary.bin", "wb");
        fwrite(&binaryFormat, sizeof binaryFormat, 1, fp);
        fwrite(&binaryLength, sizeof binaryLength, 1, fp);
        fwrite(binary, 1, binaryLength, fp);
        fclose(fp);
    }

    free(binary);
   
    glDeleteShader(fragShader);
    glDeleteShader(vertShader);
    glDeleteProgram(program);

    program = glCreateProgram();

    fp = fopen("program_binary.bin", "rb");
    fread(&binaryFormat, sizeof binaryFormat, 1, fp);
    fread(&binaryLength, sizeof binaryLength, 1, fp);
    binary = malloc(binaryLength);
    fread(binary, 1, binaryLength, fp);
    fclose(fp);

    glProgramBinary(program, binaryFormat, binary, binaryLength);
    
    GLint status = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &status);
    if (!status) {
        GLsizei len;
        char log[1000];
        glGetProgramInfoLog(program, sizeof log, &len, log);
        fprintf(stderr, "warning: glProgramBinary failed -- %s\n", log);
    }
    if (tracing && status) {
        exit(EXIT_FAILURE);
    }

    if (status) {
        draw();
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}